

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clu_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint rid;
  uint32_t uVar1;
  undefined8 in_RAX;
  PresageArchive *archive;
  PresageArchiveMember *member;
  CLU *clu;
  int *piVar2;
  char *pcVar3;
  uint8_t *puVar4;
  char *pcVar5;
  ulong uVar6;
  LPStatus status;
  LPStatus local_34;
  
  local_34 = (LPStatus)((ulong)in_RAX >> 0x20);
  if (argc < 3) {
    LPWarn("(CLU test)","usage: clu_test <prx> <rid>");
    return 1;
  }
  pcVar3 = argv[1];
  rid = atoi(argv[2]);
  archive = PresageArchive_NewFromFiles(pcVar3,(char *)0x0,&local_34);
  if (archive == (PresageArchive *)0x0) {
    pcVar5 = LPStatusString(local_34);
    LPWarn("(CLU test)","couldn\'t read %s: %s",pcVar3,pcVar5);
    if (local_34 != LUNAPURPURA_CANTOPENFILE) goto LAB_00102550;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    pcVar5 = "%s";
  }
  else {
    member = PresageArchive_MemberWithResourceId(archive,"CLU",rid);
    if (member == (PresageArchiveMember *)0x0) {
      LPWarn("(CLU test)","couldn\'t find CLU-type PRX member with RID %ld",(ulong)rid);
      goto LAB_00102550;
    }
    uVar1 = PresageArchive_AbsoluteOffsetForMember(archive,member);
    fseek((FILE *)((archive->archive).prdprs)->header_fp,(ulong)uVar1,0);
    clu = CLU_NewFromFile(((archive->archive).prdprs)->header_fp,&local_34);
    if (clu != (CLU *)0x0) {
      puVar4 = clu->array[0] + 2;
      uVar6 = 0;
      do {
        LPWarn("(CLU test)","%d\t(%d, %d, %d)",uVar6 & 0xffffffff,
               (ulong)(*(uint8_t (*) [3])(puVar4 + -2))[0],(ulong)puVar4[-1],(ulong)*puVar4);
        uVar6 = uVar6 + 1;
        puVar4 = puVar4 + 3;
      } while (uVar6 != 0x100);
      CLU_Free(clu);
      PresageArchive_Close(archive);
      return 0;
    }
    pcVar3 = LPStatusString(local_34);
    pcVar5 = "couldn\'t create CLU: %s";
  }
  LPWarn("(CLU test)",pcVar5,pcVar3);
LAB_00102550:
  CLU_Free((CLU *)0x0);
  PresageArchive_Close(archive);
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
	if (argc < 3) {
		LPWarn(MSGPREFIX, "usage: clu_test <prx> <rid>");
		return EXIT_FAILURE;
	}

	char *path = argv[1];
	uint32_t rid = (uint32_t)atoi(argv[2]);

	PresageArchiveMember *member = NULL;
	CLU *clu = NULL;

	LPStatus status;
	/* XXX PRX only for now */
	PresageArchive *archive = PresageArchive_NewFromFiles(path, NULL, &status);

	if (!archive) {
		LPWarn(MSGPREFIX, "couldn't read %s: %s", path, LPStatusString(status));
		if (status == LUNAPURPURA_CANTOPENFILE) {
			LPWarn(MSGPREFIX, "%s", strerror(errno));
		}
		goto fail;
	}

	member = PresageArchive_MemberWithResourceId(archive, "CLU", rid);

	if (!member) {
		LPWarn(MSGPREFIX, "couldn't find CLU-type PRX member with RID %ld", rid);
		goto fail;
	}

	uint32_t offset = PresageArchive_AbsoluteOffsetForMember(archive, member);
	fseek(archive->archive.prx->fp, (long)offset, SEEK_SET);
	clu = CLU_NewFromFile(archive->archive.prx->fp, &status);

	if (!clu) {
		LPWarn(MSGPREFIX, "couldn't create CLU: %s", LPStatusString(status));
		goto fail;
	}

	uint8_t *color = NULL;

	for (int i = 0; i < CLU_NELEMENTS; i++) {
		color = clu->array[i];
		LPWarn(MSGPREFIX, "%d\t(%d, %d, %d)", i, color[0], color[1], color[2]);
	}

	CLU_Free(clu);
	PresageArchive_Close(archive);
	return EXIT_SUCCESS;

fail:
	CLU_Free(clu);
	PresageArchive_Close(archive);
	return EXIT_FAILURE;
}